

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O3

void __thiscall MyEntity::MyEntity(MyEntity *this,string *name)

{
  SignalPtr<double,_int> *this_00;
  SignalTimeDependent<double,_int> *this_01;
  long *plVar1;
  size_type *psVar2;
  undefined1 local_e0 [64];
  string local_a0;
  string local_80;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  dynamicgraph::Entity::Entity(&this->super_Entity,(string *)name);
  *(undefined ***)this = &PTR__MyEntity_00126a50;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 "MyEntity(",name);
  plVar1 = (long *)std::__cxx11::string::append(local_e0);
  this_00 = &this->m_sigdSIN;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_80.field_2._M_allocated_capacity = *psVar2;
    local_80.field_2._8_8_ = plVar1[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar2;
    local_80._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_80._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  dynamicgraph::SignalPtr<double,_int>::SignalPtr(this_00,(Signal<double,_int> *)0x0,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  local_60._8_8_ = update;
  local_60._16_8_ = 0;
  local_60._0_8_ =
       boost::function2<double&,double&,int>::
       assign_to<boost::_bi::bind_t<double&,boost::_mfi::mf2<double&,MyEntity,double&,int_const&>,boost::_bi::list3<boost::_bi::value<MyEntity*>,boost::arg<1>,boost::arg<2>>>>(boost::_bi::bind_t<double&,boost::_mfi::mf2<double&,MyEntity,double&,int_const&>,boost::_bi::list3<boost::_bi::value<MyEntity*>,boost::arg<int>,boost::arg<int>>>)
       ::stored_vtable + 1;
  local_60._24_8_ = this;
  dynamicgraph::SignalArray_const<int>::SignalArray_const
            ((SignalArray_const<int> *)local_e0,
             (SignalBase<int> *)
             ((long)&this_00->_vptr_SignalPtr + (long)(this->m_sigdSIN)._vptr_SignalPtr[-3]));
  std::operator+(&local_40,"MyEntity(",name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  this_01 = &this->m_sigdTimeDepSOUT;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_a0.field_2._M_allocated_capacity = *psVar2;
    local_a0.field_2._8_8_ = plVar1[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar2;
    local_a0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_a0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  dynamicgraph::SignalTimeDependent<double,_int>::SignalTimeDependent
            (this_01,(function2<double_&,_double_&,_int> *)local_60,
             (SignalArray_const<int> *)local_e0,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_e0._0_8_ = &PTR__SignalArray_const_001278c8;
  if ((pointer)local_e0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._8_8_,local_e0._24_8_ - local_e0._8_8_);
  }
  boost::function2<double_&,_double_&,_int>::~function2
            ((function2<double_&,_double_&,_int> *)local_60);
  dynamicgraph::operator<<
            ((SignalArray<int> *)local_e0,
             (SignalBase<int> *)
             ((long)&this_00->_vptr_SignalPtr + (long)this_00->_vptr_SignalPtr[-3]),
             (SignalBase<int> *)
             ((long)&(this_01->super_TimeDependency<int>)._vptr_TimeDependency +
             (long)(this_01->super_TimeDependency<int>)._vptr_TimeDependency[-3]));
  dynamicgraph::Entity::signalRegistration((SignalArray *)this);
  dynamicgraph::SignalArray<int>::~SignalArray((SignalArray<int> *)local_e0);
  return;
}

Assistant:

explicit MyEntity(const std::string &name)
      : Entity(name),
        m_sigdSIN(NULL, "MyEntity(" + name + ")::input(double)::in_double"),
        m_sigdTimeDepSOUT(boost::bind(&MyEntity::update, this, _1, _2),
                          m_sigdSIN,
                          "MyEntity(" + name + ")::input(double)::out_double") {
    signalRegistration(m_sigdSIN << m_sigdTimeDepSOUT);
  }